

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  pvVar1 = &(this->super_IfcReinforcingElement).field_0x178 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x178) = 0x890a80;
  *(undefined8 *)((long)pvVar1 + 0x78) = 0x890bc0;
  *(undefined8 *)((long)pvVar1 + -0xf0) = 0x890aa8;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x890ad0;
  *(undefined8 *)((long)pvVar1 + -0xa8) = 0x890af8;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x890b20;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x890b48;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x890b70;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x890b98;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                     super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                     field_0x0 + lVar2),&PTR_construction_vtable_24__00890848);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}